

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

_Bool pageant_add_ssh2_key(ssh2_userkey *skey)

{
  size_t sVar1;
  PageantKey *pk;
  strbuf *psVar2;
  PageantKey *pPVar3;
  char *pcVar4;
  _Bool _Var5;
  
  pk = (PageantKey *)safemalloc(1,0x58,0);
  *(undefined8 *)&pk->sort = 0;
  (pk->sort).public_blob.ptr = (void *)0x0;
  (pk->sort).public_blob.len = 0;
  pk->public_blob = (strbuf *)0x0;
  pk->comment = (char *)0x0;
  (pk->field_3).rkey = (RSAKey *)0x0;
  *(undefined8 *)&pk->dlgid = 0;
  pk->encrypted_key_file = (strbuf *)0x0;
  *(undefined8 *)&pk->decryption_prompt_active = 0;
  (pk->blocked_requests).prev = (PageantKeyRequestNode *)0x0;
  (pk->blocked_requests).next = (PageantKeyRequestNode *)0x0;
  (pk->sort).ssh_version = 2;
  psVar2 = strbuf_new();
  (*skey->key->vt->public_blob)(skey->key,psVar2->binarysink_);
  pk->public_blob = psVar2;
  sVar1 = psVar2->len;
  (pk->sort).public_blob.ptr = psVar2->u;
  (pk->sort).public_blob.len = sVar1;
  (pk->blocked_requests).prev = &pk->blocked_requests;
  (pk->blocked_requests).next = &pk->blocked_requests;
  pPVar3 = (PageantKey *)add234(keytree,pk);
  if (pPVar3 == pk) {
    (pk->field_3).skey = skey;
    _Var5 = true;
    if (skey->comment != (char *)0x0) {
      pcVar4 = dupstr(skey->comment);
      pk->comment = pcVar4;
    }
  }
  else if ((pPVar3->field_3).rkey == (RSAKey *)0x0) {
    (pPVar3->field_3).skey = skey;
    pk_free(pk);
    _Var5 = true;
  }
  else {
    pk_free(pk);
    _Var5 = false;
  }
  return _Var5;
}

Assistant:

static bool pageant_add_ssh2_key(ssh2_userkey *skey)
{
    PageantKey *pk = snew(PageantKey);
    memset(pk, 0, sizeof(PageantKey));
    pk->sort.ssh_version = 2;
    pk->public_blob = makeblob2(skey);
    pk->sort.public_blob = ptrlen_from_strbuf(pk->public_blob);
    pk->blocked_requests.next = pk->blocked_requests.prev =
        &pk->blocked_requests;

    PageantKey *pk_in_tree = add234(keytree, pk);
    if (pk_in_tree == pk) {
        /* The key wasn't in the tree at all, and we've just added it. */
        pk->skey = skey;
        if (skey->comment)
            pk->comment = dupstr(skey->comment);
        return true;
    } else if (!pk_in_tree->skey) {
        /* The key was only stored encrypted, and now we have an
         * unencrypted version to add to the existing record. */
        pk_in_tree->skey = skey;
        pk_free(pk);
        return true;
    } else {
        /* The key was already in the tree in full. */
        pk_free(pk);
        return false;
    }
}